

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O3

void __thiscall Liby::TcpClient::start(TcpClient *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Channel *this_00;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 local_59;
  undefined1 local_58 [16];
  _Manager_type local_48;
  code *local_40;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  if (((this->loop_ != (EventLoop *)0x0) &&
      (peVar1 = (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      peVar1 != (element_type *)0x0)) && (this->poller_ != (Poller *)0x0)) {
    local_30._0_4_ = peVar1->fd_;
    local_58._0_8_ = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Channel,std::allocator<Liby::Channel>,Liby::Poller*&,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),(Channel **)local_58,
               (allocator<Liby::Channel> *)&local_59,&this->poller_,(int *)local_30._M_pod_data);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = (Channel *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    this_00 = (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00->readable_ = false;
    this_00->writable_ = true;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp:19:17)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp:19:17)>
               ::_M_manager;
    local_58._0_8_ = this;
    std::function<void_()>::operator=(&this_00->writEventCallback_,(function<void_()> *)local_58);
    local_30._8_8_ = 0;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp:48:17)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp:48:17)>
               ::_M_manager;
    local_30._M_unused._M_object = this;
    std::function<void_()>::operator=(&this_00->erroEventCallback_,(function<void_()> *)&local_30);
    Channel::addChannel(this_00);
    if (local_20 != (code *)0x0) {
      (*local_20)(&local_30,&local_30,__destroy_functor);
    }
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
    }
    std::__shared_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Liby::TcpClient,void>
              ((__shared_ptr<Liby::TcpClient,(__gnu_cxx::_Lock_policy)2> *)local_58,
               (__weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<Liby::TcpClient>);
    uVar4 = local_58._8_8_;
    uVar3 = local_58._0_8_;
    local_58._0_8_ = (Channel *)0x0;
    local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var2 = (this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar3;
    (this->self_).super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      }
    }
    return;
  }
  __assert_fail("loop_ && socket_ && poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpClient.cpp"
                ,0xf,"void Liby::TcpClient::start()");
}

Assistant:

void TcpClient::start() {
    //    assert(connector_);
    assert(loop_ && socket_ && poller_);
    chan_ = std::make_shared<Channel>(poller_, socket_->fd());
    chan_->enableRead(false)
        .enableWrit()
        .onWrit([this] {
            auto x = shared_from_this();
            //            if (!socket_) {
            //                auto p = chan_.get();
            //                socket_.reset();
            //            }
            ConnPtr connPtr = std::make_shared<Connection>(loop_, socket_);
            connPtr->setChannel(chan_);
            if (context_) {
                connPtr->context_ = context_;
            }
            Connector connector = connector_;

            loop_->nextTick([&, connPtr, connector] {
                chan_->onWrit(nullptr);
                chan_->onErro(nullptr);
                destroy();

                connPtr->init();
                connPtr->enableRead();
                if (connector) {
                    connector(connPtr);
                }
            });

            chan_->enableRead(false);
            chan_->enableWrit(false);
            chan_->updateChannel();
        })
        .onErro([this] {
            auto x = shared_from_this();
            if (connector_) {
                connector_(nullptr);
            }
            destroy();
        })
        .addChannel();
    self_ = shared_from_this();
}